

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-chat.cpp
# Opt level: O0

int32_t llama_chat_builtin_templates(char **output,size_t len)

{
  ulong uVar1;
  const_iterator cVar2;
  unsigned_long *puVar3;
  undefined8 uVar4;
  size_type sVar5;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>
  *in_RSI;
  long in_RDI;
  size_t i;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>_>
  *in_stack_ffffffffffffffc8;
  size_type local_28;
  ulong local_20;
  
  cVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>_>
          ::begin(in_stack_ffffffffffffffc8);
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    local_28 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>_>
               ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>_>
                       *)0x3d431e);
    puVar3 = std::min<unsigned_long>((unsigned_long *)&stack0xfffffffffffffff0,&local_28);
    if (*puVar3 <= uVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>
                  *)0x3d4349);
    uVar4 = std::__cxx11::string::c_str();
    *(undefined8 *)(in_RDI + local_20 * 8) = uVar4;
    std::
    advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,llm_chat_template>>,int>
              (in_RSI,(int)((ulong)cVar2._M_node >> 0x20));
    local_20 = local_20 + 1;
  }
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llm_chat_template>_>_>
                  *)0x3d438d);
  return (int32_t)sVar5;
}

Assistant:

int32_t llama_chat_builtin_templates(const char ** output, size_t len) {
    auto it = LLM_CHAT_TEMPLATES.begin();
    for (size_t i = 0; i < std::min(len, LLM_CHAT_TEMPLATES.size()); i++) {
        output[i] = it->first.c_str();
        std::advance(it, 1);
    }
    return (int32_t) LLM_CHAT_TEMPLATES.size();
}